

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  ushort uVar1;
  int iVar2;
  ImFontAtlasCustomRect *pIVar3;
  stbrp_rect *psVar4;
  long in_RDI;
  int i_1;
  int i;
  ImVector<stbrp_rect> pack_rects;
  ImVector<ImFontAtlasCustomRect> *user_rects;
  stbrp_context *pack_context;
  int in_stack_ffffffffffffff0c;
  stbrp_coord sVar5;
  stbrp_rect *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2e;
  unsigned_short uVar6;
  stbrp_context *in_stack_ffffffffffffff30;
  int local_44;
  int local_40;
  ImVector<stbrp_rect> local_30;
  ImVector<ImFontAtlasCustomRect> *local_20;
  long local_8;
  
  local_20 = (ImVector<ImFontAtlasCustomRect> *)(in_RDI + 0x68);
  local_8 = in_RDI;
  ImVector<stbrp_rect>::ImVector(&local_30);
  ImVector<stbrp_rect>::resize
            ((ImVector<stbrp_rect> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  iVar2 = ImVector<stbrp_rect>::size_in_bytes(&local_30);
  memset(local_30.Data,0,(long)iVar2);
  for (local_40 = 0; iVar2 = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),
      local_40 < local_20->Size; local_40 = local_40 + 1) {
    pIVar3 = ImVector<ImFontAtlasCustomRect>::operator[](local_20,local_40);
    uVar1 = pIVar3->Width;
    psVar4 = ImVector<stbrp_rect>::operator[](&local_30,local_40);
    psVar4->w = (uint)uVar1;
    pIVar3 = ImVector<ImFontAtlasCustomRect>::operator[](local_20,local_40);
    uVar1 = pIVar3->Height;
    psVar4 = ImVector<stbrp_rect>::operator[](&local_30,local_40);
    psVar4->h = (uint)uVar1;
  }
  ImVector<stbrp_rect>::operator[](&local_30,0);
  stbrp_pack_rects(in_stack_ffffffffffffff30,
                   (stbrp_rect *)CONCAT26(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28),iVar2
                  );
  for (local_44 = 0; local_44 < local_30.Size; local_44 = local_44 + 1) {
    psVar4 = ImVector<stbrp_rect>::operator[](&local_30,local_44);
    if (psVar4->was_packed != 0) {
      psVar4 = ImVector<stbrp_rect>::operator[](&local_30,local_44);
      sVar5 = psVar4->x;
      pIVar3 = ImVector<ImFontAtlasCustomRect>::operator[](local_20,local_44);
      pIVar3->X = (unsigned_short)sVar5;
      psVar4 = ImVector<stbrp_rect>::operator[](&local_30,local_44);
      uVar6 = (unsigned_short)psVar4->y;
      pIVar3 = ImVector<ImFontAtlasCustomRect>::operator[](local_20,local_44);
      pIVar3->Y = uVar6;
      iVar2 = *(int *)(local_8 + 0x44);
      psVar4 = ImVector<stbrp_rect>::operator[](&local_30,local_44);
      sVar5 = psVar4->y;
      in_stack_ffffffffffffff10 = ImVector<stbrp_rect>::operator[](&local_30,local_44);
      iVar2 = ImMax<int>(iVar2,sVar5 + in_stack_ffffffffffffff10->h);
      *(int *)(local_8 + 0x44) = iVar2;
    }
  }
  ImVector<stbrp_rect>::~ImVector((ImVector<stbrp_rect> *)in_stack_ffffffffffffff10);
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.
#ifdef __GNUC__
    if (user_rects.Size < 1) { __builtin_unreachable(); } // Workaround for GCC bug if IM_ASSERT() is defined to conditionally throw (see #5343)
#endif

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = (unsigned short)pack_rects[i].x;
            user_rects[i].Y = (unsigned short)pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}